

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

void __thiscall booster::fork_shared_mutex::unlock(fork_shared_mutex *this)

{
  int iVar1;
  data *pdVar2;
  int *piVar3;
  pthread_rwlock_t *__rwlock;
  hold_ptr<booster::fork_shared_mutex::data> *in_RDI;
  bool bVar4;
  int res;
  flock lock;
  undefined2 local_28;
  undefined2 local_26;
  
  memset(&local_28,0,0x20);
  local_28 = 2;
  local_26 = 0;
  do {
    pdVar2 = hold_ptr<booster::fork_shared_mutex::data>::operator->(in_RDI);
    iVar1 = fileno((FILE *)pdVar2->lock_file);
    iVar1 = fcntl(iVar1,7,&local_28);
    bVar4 = false;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  __rwlock = (pthread_rwlock_t *)hold_ptr<booster::fork_shared_mutex::data>::operator->(in_RDI);
  pthread_rwlock_unlock(__rwlock);
  return;
}

Assistant:

void fork_shared_mutex::unlock()
	{
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_UNLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLKW,&lock))!=0 && errno==EINTR)
			;
		pthread_rwlock_unlock(&d->lock);
	}